

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rendering.cpp
# Opt level: O2

void __thiscall duckdb::Linenoise::RefreshSearch(Linenoise *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  ulong uVar2;
  pointer psVar3;
  bool bVar4;
  ulong uVar5;
  size_t sVar6;
  size_t sVar7;
  char *__s;
  size_t sVar8;
  ulong cols;
  searchMatch *in_stack_fffffffffffffe58;
  string highlight_buffer;
  string matches_text;
  string search_prompt;
  size_t search_render_pos;
  size_t search_len;
  char *search_buf;
  string local_118;
  string no_matches_text;
  Linenoise clone;
  
  search_prompt._M_dataplus._M_p = (pointer)&search_prompt.field_2;
  search_prompt._M_string_length = 0;
  search_prompt.field_2._M_local_buf[0] = '\0';
  ::std::__cxx11::string::string((string *)&no_matches_text,"(no matches)",(allocator *)&clone);
  uVar2 = this->search_index;
  uVar5 = ((long)(this->search_matches).
                 super__Vector_base<duckdb::searchMatch,_std::allocator<duckdb::searchMatch>_>.
                 _M_impl.super__Vector_impl_data._M_finish -
          (long)(this->search_matches).
                super__Vector_base<duckdb::searchMatch,_std::allocator<duckdb::searchMatch>_>.
                _M_impl.super__Vector_impl_data._M_start) / 0x18;
  paVar1 = &highlight_buffer.field_2;
  highlight_buffer._M_dataplus._M_p = (pointer)paVar1;
  if ((this->search_buf)._M_string_length == 0) {
    ::std::__cxx11::string::_M_construct((ulong)&highlight_buffer,'\x14');
    ::std::operator+(&matches_text,"search",&highlight_buffer);
    ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&clone,
                     &matches_text,"> ");
    ::std::__cxx11::string::operator=((string *)&search_prompt,(string *)&clone);
    ::std::__cxx11::string::~string((string *)&clone);
    ::std::__cxx11::string::~string((string *)&matches_text);
    ::std::__cxx11::string::~string((string *)&highlight_buffer);
    ::std::__cxx11::string::assign((char *)&no_matches_text);
  }
  else {
    clone._0_8_ = &clone.buflen;
    clone.buf = (char *)0x0;
    clone.buflen._0_1_ = 0;
    matches_text._M_dataplus._M_p = (pointer)&matches_text.field_2;
    matches_text._M_string_length = 0;
    matches_text.field_2._M_local_buf[0] = '\0';
    ::std::__cxx11::string::append((string *)&clone);
    if (uVar2 < uVar5) {
      ::std::__cxx11::to_string(&highlight_buffer,this->search_index + 1);
      ::std::__cxx11::string::append((string *)&matches_text);
      ::std::__cxx11::string::~string((string *)&highlight_buffer);
      ::std::__cxx11::to_string
                (&local_118,
                 ((long)(this->search_matches).
                        super__Vector_base<duckdb::searchMatch,_std::allocator<duckdb::searchMatch>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                 (long)(this->search_matches).
                       super__Vector_base<duckdb::searchMatch,_std::allocator<duckdb::searchMatch>_>
                       ._M_impl.super__Vector_impl_data._M_start) / 0x18);
      ::std::operator+(&highlight_buffer,"/",&local_118);
      ::std::__cxx11::string::append((string *)&matches_text);
      ::std::__cxx11::string::~string((string *)&highlight_buffer);
      ::std::__cxx11::string::~string((string *)&local_118);
    }
    sVar6 = ComputeRenderWidth((char *)clone._0_8_,(size_t)clone.buf);
    sVar7 = ComputeRenderWidth(matches_text._M_dataplus._M_p,matches_text._M_string_length);
    if (sVar6 + sVar7 < 0x1a) {
      ::std::__cxx11::string::_M_assign((string *)&search_prompt);
      ::std::__cxx11::string::_M_construct((ulong)&highlight_buffer,'\x1a' - (char)(sVar6 + sVar7));
      ::std::__cxx11::string::append((string *)&search_prompt);
      ::std::__cxx11::string::~string((string *)&highlight_buffer);
      ::std::__cxx11::string::append((string *)&search_prompt);
      ::std::__cxx11::string::append((char *)&search_prompt);
    }
    else {
      search_buf = (char *)clone._0_8_;
      search_len = (size_t)clone.buf;
      search_render_pos = 0;
      cols = 0x19 - sVar7;
      if (0x13 < sVar7) {
        cols = 0x19;
      }
      highlight_buffer._M_string_length = 0;
      highlight_buffer.field_2._M_local_buf[0] = '\0';
      renderText(&search_render_pos,&search_buf,&search_len,(size_t)clone.buf,cols,0,
                 &highlight_buffer,false,in_stack_fffffffffffffe58);
      local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_118,search_buf,search_buf + search_len);
      ::std::__cxx11::string::operator=((string *)&search_prompt,(string *)&local_118);
      ::std::__cxx11::string::~string((string *)&local_118);
      for (sVar6 = search_render_pos; sVar6 < cols; sVar6 = sVar6 + 1) {
        ::std::__cxx11::string::append((char *)&search_prompt);
      }
      if (sVar7 < 0x14) {
        ::std::__cxx11::string::append((string *)&search_prompt);
      }
      ::std::__cxx11::string::append((char *)&search_prompt);
      ::std::__cxx11::string::~string((string *)&highlight_buffer);
    }
    ::std::__cxx11::string::~string((string *)&matches_text);
    ::std::__cxx11::string::~string((string *)&clone);
  }
  bVar4 = Highlighting::IsEnabled();
  Linenoise(&clone,this);
  this->prompt = search_prompt._M_dataplus._M_p;
  this->plen = search_prompt._M_string_length;
  if ((uVar2 < uVar5) && ((this->search_buf)._M_string_length != 0)) {
    psVar3 = (this->search_matches).
             super__Vector_base<duckdb::searchMatch,_std::allocator<duckdb::searchMatch>_>._M_impl.
             super__Vector_impl_data._M_start;
    sVar6 = psVar3[this->search_index].match_end;
    __s = History::GetEntry(psVar3[this->search_index].history_index);
    this->buf = __s;
    sVar8 = strlen(__s);
    this->len = sVar8;
    this->pos = sVar6;
  }
  else {
    this->buf = no_matches_text._M_dataplus._M_p;
    this->len = no_matches_text._M_string_length;
    this->pos = 0;
    Highlighting::Disable();
  }
  RefreshLine(this);
  if (bVar4) {
    Highlighting::Enable();
  }
  this->buf = clone.buf;
  this->len = clone.len;
  this->prompt = clone.prompt;
  this->plen = clone.plen;
  this->pos = clone.pos;
  ~Linenoise(&clone);
  ::std::__cxx11::string::~string((string *)&no_matches_text);
  ::std::__cxx11::string::~string((string *)&search_prompt);
  return;
}

Assistant:

void Linenoise::RefreshSearch() {
	std::string search_prompt;
	static const size_t SEARCH_PROMPT_RENDER_SIZE = 28;
	std::string no_matches_text = "(no matches)";
	bool no_matches = search_index >= search_matches.size();
	if (search_buf.empty()) {
		search_prompt = "search" + std::string(SEARCH_PROMPT_RENDER_SIZE - 8, ' ') + "> ";
		no_matches_text = "(type to search)";
	} else {
		std::string search_text;
		std::string matches_text;
		search_text += search_buf;
		if (!no_matches) {
			matches_text += std::to_string(search_index + 1);
			matches_text += "/" + std::to_string(search_matches.size());
		}
		size_t search_text_length = ComputeRenderWidth(search_text.c_str(), search_text.size());
		size_t matches_text_length = ComputeRenderWidth(matches_text.c_str(), matches_text.size());
		size_t total_text_length = search_text_length + matches_text_length;
		if (total_text_length < SEARCH_PROMPT_RENDER_SIZE - 2) {
			// search text is short: we can render the entire search text
			search_prompt = search_text;
			search_prompt += std::string(SEARCH_PROMPT_RENDER_SIZE - 2 - total_text_length, ' ');
			search_prompt += matches_text;
			search_prompt += "> ";
		} else {
			// search text length is too long to fit: truncate
			bool render_matches = matches_text_length < SEARCH_PROMPT_RENDER_SIZE - 8;
			char *search_buf = (char *)search_text.c_str();
			size_t search_len = search_text.size();
			size_t search_render_pos = 0;
			size_t max_render_size = SEARCH_PROMPT_RENDER_SIZE - 3;
			if (render_matches) {
				max_render_size -= matches_text_length;
			}
			std::string highlight_buffer;
			renderText(search_render_pos, search_buf, search_len, search_len, max_render_size, 0, highlight_buffer,
			           false);
			search_prompt = std::string(search_buf, search_len);
			for (size_t i = search_render_pos; i < max_render_size; i++) {
				search_prompt += " ";
			}
			if (render_matches) {
				search_prompt += matches_text;
			}
			search_prompt += "> ";
		}
	}
	auto oldHighlighting = Highlighting::IsEnabled();
	Linenoise clone = *this;
	prompt = search_prompt.c_str();
	plen = search_prompt.size();
	if (no_matches || search_buf.empty()) {
		// if there are no matches render the no_matches_text
		buf = (char *)no_matches_text.c_str();
		len = no_matches_text.size();
		pos = 0;
		// don't highlight the "no_matches" text
		Highlighting::Disable();
	} else {
		// if there are matches render the current history item
		auto search_match = search_matches[search_index];
		auto history_index = search_match.history_index;
		auto cursor_position = search_match.match_end;
		buf = (char *)History::GetEntry(history_index);
		len = strlen(buf);
		pos = cursor_position;
	}
	RefreshLine();

	if (oldHighlighting) {
		Highlighting::Enable();
	}
	buf = clone.buf;
	len = clone.len;
	pos = clone.pos;
	prompt = clone.prompt;
	plen = clone.plen;
}